

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double __thiscall DynamicHistogram<double>::frequency(DynamicHistogram<double> *this,int index)

{
  uint uVar1;
  runtime_error *this_00;
  double dVar2;
  int index_local;
  DynamicHistogram<double> *this_local;
  
  uVar1 = (*this->_vptr_DynamicHistogram[2])();
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::frequency - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar2 = frequency_(this,index);
  return dVar2;
}

Assistant:

double
    frequency(int const index)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::frequency - Histogram could not be initialized.");
        return this->frequency_(index);
    }